

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles31::Functional::PackUnorm4x8Case::iterate(PackUnorm4x8Case *this)

{
  ShaderExecutor *pSVar1;
  deUint32 dVar2;
  deInt32 dVar3;
  int iVar4;
  char *pcVar5;
  size_type sVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  float *pfVar10;
  reference pvVar11;
  float fVar12;
  int local_788;
  int local_784;
  int local_774;
  MessageBuilder local_770;
  MessageBuilder local_5f0;
  Vector<int,_4> local_470;
  Hex<8UL> local_460;
  Hex<8UL> local_458;
  MessageBuilder local_450;
  int local_2d0;
  int local_2cc;
  int diff3;
  int diff2;
  int diff1;
  int diff0;
  deUint16 res3;
  deUint16 res2;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  deUint16 ref3;
  deUint16 ref2;
  deUint16 ref1;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  void *out;
  void *in;
  MessageBuilder local_280;
  Vector<float,_4> local_fc;
  float local_ec;
  float local_e8;
  float w_1;
  float z_1;
  float y_1;
  float x_1;
  int ndx_1;
  float local_c8;
  float local_c4;
  float w;
  float z;
  float y;
  float x;
  int ndx;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84 [2];
  Vector<float,_4> local_64;
  int local_54;
  undefined1 local_50 [4];
  int maxDiff;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  Random rnd;
  PackUnorm4x8Case *this_local;
  
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar5);
  de::Random::Random((Random *)
                     &inputs.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar2 ^ 0x776002);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  if (this->m_precision == PRECISION_HIGHP) {
    local_784 = 1;
  }
  else {
    if (this->m_precision == PRECISION_MEDIUMP) {
      local_788 = 1;
    }
    else {
      local_788 = 0;
      if (this->m_precision == PRECISION_LOWP) {
        local_788 = 2;
      }
    }
    local_784 = local_788;
  }
  local_54 = local_784;
  tcu::Vector<float,_4>::Vector(&local_64,0.0,0.0,0.0,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_64);
  tcu::Vector<float,_4>::Vector(local_84,-1.0,1.0,-1.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_84);
  tcu::Vector<float,_4>::Vector(&local_94,0.5,-0.5,-0.5,0.5);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_94);
  tcu::Vector<float,_4>::Vector(&local_a4,-1.5,1.5,-1.5,1.5);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_a4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.25,-0.75,-0.25,0.75);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&x);
  for (y = 0.0; (int)y < 0xf; y = (float)((int)y + 1)) {
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    z = fVar12 * 1.25 + -0.125;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    w = fVar12 * 1.25 + -0.125;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c4 = fVar12 * 1.25 + -0.125;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c8 = fVar12 * 1.25 + -0.125;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x_1,z,w,local_c4,local_c8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&x_1);
  }
  for (y_1 = 0.0; (int)y_1 < 0x50; y_1 = (float)((int)y_1 + 1)) {
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    z_1 = fVar12 * 1e+06 + -100000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    w_1 = fVar12 * 1e+06 + -100000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_e8 = fVar12 * 1e+06 + -100000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_ec = fVar12 * 1e+06 + -100000.0;
    tcu::Vector<float,_4>::Vector(&local_fc,z_1,w_1,local_e8,local_ec);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_fc);
  }
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar6);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_280,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(unsigned_long *)&in);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  out = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0);
  _maxPrints = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pSVar1->_vptr_ShaderExecutor[6])(pSVar1,sVar6 & 0xffffffff,&out,&maxPrints);
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar6;
  valNdx = 10;
  _ref1 = 0;
  for (_ref3 = 0; iVar4 = _ref3,
      sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage), iVar4 < (int)sVar6;
      _ref3 = _ref3 + 1) {
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::x(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,0.0,1.0);
    dVar3 = ::deRoundFloatToInt32(fVar12 * 255.0);
    iVar4 = de::clamp<int>(dVar3,0,0xff);
    ref._2_2_ = (ushort)iVar4 & 0xff;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::y(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,0.0,1.0);
    dVar3 = ::deRoundFloatToInt32(fVar12 * 255.0);
    iVar4 = de::clamp<int>(dVar3,0,0xff);
    ref._0_2_ = (ushort)iVar4 & 0xff;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::z(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,0.0,1.0);
    dVar3 = ::deRoundFloatToInt32(fVar12 * 255.0);
    iVar4 = de::clamp<int>(dVar3,0,0xff);
    res._2_2_ = (ushort)iVar4 & 0xff;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::w(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,0.0,1.0);
    dVar3 = ::deRoundFloatToInt32(fVar12 * 255.0);
    iVar4 = de::clamp<int>(dVar3,0,0xff);
    res._0_2_ = (ushort)iVar4 & 0xff;
    _res1 = (uint)(ushort)res << 0x18 | (uint)res._2_2_ << 0x10 | (uint)(ushort)ref << 8 |
            (uint)ref._2_2_;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(long)_ref3
                        );
    _res3 = *pvVar11;
    diff0._2_2_ = (ushort)_res3 & 0xff;
    diff0._0_2_ = (ushort)(_res3 >> 8) & 0xff;
    diff1._2_2_ = (ushort)(_res3 >> 0x10) & 0xff;
    diff1._0_2_ = (ushort)(byte)(_res3 >> 0x18);
    diff2 = de::abs<int>((uint)ref._2_2_ - (uint)diff0._2_2_);
    diff3 = de::abs<int>((uint)(ushort)ref - (uint)(ushort)diff0);
    local_2cc = de::abs<int>((uint)res._2_2_ - (uint)diff1._2_2_);
    local_2d0 = de::abs<int>((uint)(ushort)res - (uint)(ushort)diff1);
    if ((((local_54 < diff2) || (local_54 < diff3)) || (local_54 < local_2cc)) ||
       (local_54 < local_2d0)) {
      if (_ref1 < 10) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_450,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_450,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&ref3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [25])", expected packUnorm4x8(");
        pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&outputs.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar9);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [5])0x2bd2712);
        local_458 = tcu::toHex<unsigned_int>(_res1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_458);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0x2c67b94);
        local_460 = tcu::toHex<unsigned_int>(_res3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_460);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])"\n  diffs = ");
        tcu::Vector<int,_4>::Vector(&local_470,diff2,diff3,local_2cc,local_2d0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_470);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])0x2bcf996);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_54);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_450);
      }
      else if (_ref1 == 10) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5f0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_5f0,(char (*) [4])0x2b5ff3d);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5f0);
      }
      _ref1 = _ref1 + 1;
    }
  }
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_770,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  local_774 = numFailed - _ref1;
  pMVar8 = tcu::MessageBuilder::operator<<(&local_770,&local_774);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2b9720c);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&numFailed);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_770);
  pcVar5 = "Result comparison failed";
  if (_ref1 == 0) {
    pcVar5 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(_ref1 != 0),pcVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      &inputs.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^8) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^8) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f - 0.125f;
			const float y = rnd.getFloat()*1.25f - 0.125f;
			const float z = rnd.getFloat()*1.25f - 0.125f;
			const float w = rnd.getFloat()*1.25f - 0.125f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			const float z = rnd.getFloat()*1e6f - 1e5f;
			const float w = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}